

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O1

MemorySpace adios2_ToMemorySpace(adios2_memory_space Cmem)

{
  return (MemorySpace)(Cmem == adios2_memory_space_host);
}

Assistant:

adios2::MemorySpace adios2_ToMemorySpace(const adios2_memory_space Cmem)
{
    adios2::MemorySpace mem = adios2::MemorySpace::Detect;
    switch (Cmem)
    {

    case adios2_memory_space_host:
        mem = adios2::MemorySpace::Host;
        break;

#ifdef ADIOS2_HAVE_GPU_SUPPORT
    case adios2_memory_space_gpu:
        mem = adios2::MemorySpace::GPU;
        break;
#endif
    default:
        break;
    }
    return mem;
}